

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# particles.c
# Opt level: O1

void update_particle(PARTICLE *p,float dt)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  
  if (p->active != 0) {
    fVar1 = dt * -0.125 + p->life;
    p->life = fVar1;
    if (fVar1 <= 0.0) {
      p->active = 0;
      return;
    }
    fVar2 = dt * -9.8 + p->vz;
    p->vz = fVar2;
    fVar4 = p->vx * dt + p->x;
    p->x = fVar4;
    fVar1 = dt * p->vy + p->y;
    p->y = fVar1;
    fVar3 = fVar2 * dt + p->z;
    p->z = fVar3;
    if ((fVar2 < 0.0) &&
       (((fVar4 * fVar4 + fVar1 * fVar1 < 3.8025002 && (fVar1 = 3.35, fVar3 < 3.35)) ||
        (fVar1 = 0.35, fVar3 < 0.35)))) {
      p->vz = fVar2 * -0.75;
      p->z = (fVar1 - fVar3) * 0.75 + fVar1;
    }
  }
  return;
}

Assistant:

static void update_particle(PARTICLE *p, float dt)
{
    // If the particle is not active, we need not do anything
    if (!p->active)
        return;

    // The particle is getting older...
    p->life -= dt * (1.f / LIFE_SPAN);

    // Did the particle die?
    if (p->life <= 0.f)
    {
        p->active = 0;
        return;
    }

    // Apply gravity
    p->vz = p->vz - GRAVITY * dt;

    // Update particle position
    p->x = p->x + p->vx * dt;
    p->y = p->y + p->vy * dt;
    p->z = p->z + p->vz * dt;

    // Simple collision detection + response
    if (p->vz < 0.f)
    {
        // Particles should bounce on the fountain (with friction)
        if ((p->x * p->x + p->y * p->y) < FOUNTAIN_R2 &&
            p->z < (FOUNTAIN_HEIGHT + PARTICLE_SIZE / 2))
        {
            p->vz = -FRICTION * p->vz;
            p->z  = FOUNTAIN_HEIGHT + PARTICLE_SIZE / 2 +
                    FRICTION * (FOUNTAIN_HEIGHT +
                    PARTICLE_SIZE / 2 - p->z);
        }

        // Particles should bounce on the floor (with friction)
        else if (p->z < PARTICLE_SIZE / 2)
        {
            p->vz = -FRICTION * p->vz;
            p->z  = PARTICLE_SIZE / 2 +
                    FRICTION * (PARTICLE_SIZE / 2 - p->z);
        }
    }
}